

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.cc
# Opt level: O1

void * calloc(size_t __nmemb,size_t __size)

{
  Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *fl;
  byte bVar1;
  anon_class_8_1_8991fb9c domesticate;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  size_t result;
  size_t size;
  BHeadPtr<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  __s;
  void *pvVar4;
  Alloc<void> AVar5;
  ulong uVar6;
  undefined8 *in_FS_OFFSET;
  anon_class_1_0_00000001 local_11;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = __size;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = __nmemb;
  size = SUB168(auVar2 * auVar3,0);
  if (SUB168(auVar2 * auVar3,8) != 0) {
    pvVar4 = snmalloc::libc::set_error(0xc);
    return pvVar4;
  }
  domesticate.this =
       (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
       *in_FS_OFFSET;
  uVar6 = size - 1;
  if (0xdfff < uVar6) {
    AVar5 = snmalloc::
            Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::
            alloc_not_small<(snmalloc::ZeroMem)1,snmalloc::CheckInitPthread>(size,domesticate.this);
    return AVar5.unsafe_capptr;
  }
  bVar1 = (&snmalloc::sizeclass_lookup)[uVar6 >> 4];
  uVar6 = (ulong)bVar1;
  fl = ((domesticate.this)->super_FastFreeLists).small_fast_free_lists + uVar6;
  if ((fl->curr).unsafe_capptr ==
      (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
       *)0x0) {
    if (((domesticate.this)->remote_alloc).list.front.unsafe_capptr._M_b._M_p ==
        ((domesticate.this)->remote_alloc).list.back.unsafe_capptr._M_b._M_p) {
      __s.unsafe_capptr =
           (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
            *)snmalloc::
              Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
              small_alloc<(snmalloc::ZeroMem)1,_snmalloc::CheckInitPthread>::anon_class_1_0_00000001
              ::operator()(&local_11,domesticate.this,uVar6,fl);
    }
    else {
      __s.unsafe_capptr =
           (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
            *)snmalloc::
              Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::
              handle_message_queue_slow<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::small_alloc<(snmalloc::ZeroMem)1,snmalloc::CheckInitPthread>(unsigned_long)::_lambda(snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>*,unsigned_long,snmalloc::freelist::Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>*)_1_,snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>*,unsigned_long,snmalloc::freelist::Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>*>
                        ((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>
                          *)domesticate.this,domesticate.this,uVar6);
    }
  }
  else {
    __s = snmalloc::freelist::
          Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>
          ::
          take<snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>>::small_alloc<(snmalloc::ZeroMem)1,snmalloc::CheckInitPthread>(unsigned_long)::_lambda(snmalloc::CapPtr<snmalloc::freelist::Object::T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>)_1_>
                    ((Iter<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)1>,snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,(snmalloc::capptr::dimension::AddressSpaceControl)0,(snmalloc::capptr::dimension::Wildness)0>>
                      *)fl,&snmalloc::freelist::Object::key_root,domesticate);
    uVar6 = *(ulong *)(snmalloc::sizeclass_metadata + ((bVar1 & 0x7f ^ 0x40) << 5));
    if ((uVar6 < 0x10001) || ((((uint)__s.unsafe_capptr | (uint)uVar6) & 0xfff) != 0)) {
      pvVar4 = memset(__s.unsafe_capptr,0,uVar6);
      return pvVar4;
    }
    madvise(__s.unsafe_capptr,uVar6,4);
  }
  return __s.unsafe_capptr;
}

Assistant:

SNMALLOC_EXPORT void* SNMALLOC_NAME_MANGLE(calloc)(size_t nmemb, size_t size)
  {
    return snmalloc::libc::calloc(nmemb, size);
  }